

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,int field_number,_func_bool_int *is_valid,
               CodedOutputStream *unknown_fields_stream,RepeatedField<int> *values)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  Limit limit;
  int iVar4;
  uint32_t first_byte_or_zero;
  int64_t iVar5;
  ulong uVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int value;
  ulong unaff_R13;
  bool bVar12;
  
  pbVar7 = input->buffer_;
  if (pbVar7 < input->buffer_end_) {
    uVar11 = (uint)*pbVar7;
    if (-1 < (char)*pbVar7) {
      input->buffer_ = pbVar7 + 1;
      bVar12 = true;
      goto LAB_0033b87a;
    }
  }
  else {
    uVar11 = 0;
  }
  iVar5 = io::CodedInputStream::ReadVarint32Fallback(input,uVar11);
  uVar11 = (uint)iVar5;
  bVar12 = -1 < iVar5;
LAB_0033b87a:
  if (bVar12) {
    limit = io::CodedInputStream::PushLimit(input,uVar11);
    uVar11 = field_number << 3;
    do {
      iVar4 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar4 < 1) {
        io::CodedInputStream::PopLimit(input,limit);
        return true;
      }
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar6 = (ulong)bVar1;
        first_byte_or_zero = (uint32_t)bVar1;
        if ((char)bVar1 < '\0') goto LAB_0033b8bd;
        input->buffer_ = pbVar7 + 1;
        bVar12 = true;
      }
      else {
        first_byte_or_zero = 0;
LAB_0033b8bd:
        uVar6 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        bVar12 = -1 < (long)uVar6;
      }
      uVar2 = unaff_R13;
      if (bVar12) {
        uVar2 = uVar6;
      }
      unaff_R13 = uVar2 & 0xffffffff;
      if (!bVar12) {
        return false;
      }
      uVar10 = (uint)uVar2;
      if ((is_valid == (_func_bool_int *)0x0) || (bVar3 = (*is_valid)(uVar10), bVar3)) {
        RepeatedField<int>::Add(values,uVar10);
      }
      else {
        pbVar7 = unknown_fields_stream->cur_;
        if ((unknown_fields_stream->impl_).end_ <= pbVar7) {
          pbVar7 = io::EpsCopyOutputStream::EnsureSpaceFallback
                             (&unknown_fields_stream->impl_,pbVar7);
        }
        unknown_fields_stream->cur_ = pbVar7;
        uVar8 = uVar11;
        uVar9 = uVar11;
        if (0x7f < uVar11) {
          do {
            *pbVar7 = (byte)uVar9 | 0x80;
            pbVar7 = pbVar7 + 1;
            bVar3 = 0x3fff < uVar9;
            uVar8 = uVar9 >> 7;
            uVar9 = uVar9 >> 7;
          } while (bVar3);
        }
        *pbVar7 = (byte)uVar8;
        pbVar7 = pbVar7 + 1;
        unknown_fields_stream->cur_ = pbVar7;
        if ((unknown_fields_stream->impl_).end_ <= pbVar7) {
          pbVar7 = io::EpsCopyOutputStream::EnsureSpaceFallback
                             (&unknown_fields_stream->impl_,pbVar7);
        }
        unknown_fields_stream->cur_ = pbVar7;
        uVar6 = unaff_R13;
        if (0x7f < uVar10) {
          do {
            uVar10 = (uint)uVar6;
            *pbVar7 = (byte)uVar6 | 0x80;
            uVar6 = uVar6 >> 7;
            pbVar7 = pbVar7 + 1;
          } while (0x3fff < uVar10);
        }
        *pbVar7 = (byte)uVar6;
        unknown_fields_stream->cur_ = pbVar7 + 1;
      }
    } while (bVar12);
  }
  return false;
}

Assistant:

bool WireFormatLite::ReadPackedEnumPreserveUnknowns(
    io::CodedInputStream* input, int field_number, bool (*is_valid)(int),
    io::CodedOutputStream* unknown_fields_stream, RepeatedField<int>* values) {
  uint32_t length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == nullptr || is_valid(value)) {
      values->Add(value);
    } else {
      uint32_t tag = WireFormatLite::MakeTag(field_number,
                                             WireFormatLite::WIRETYPE_VARINT);
      unknown_fields_stream->WriteVarint32(tag);
      unknown_fields_stream->WriteVarint32(value);
    }
  }
  input->PopLimit(limit);
  return true;
}